

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

void ecs_clear(ecs_world_t *world,ecs_entity_t entity)

{
  ecs_vector_t *vector;
  ecs_world_t *world_00;
  _Bool _Var1;
  ecs_stage_t *stage;
  ecs_entity_t *peVar2;
  ecs_table_t *dst_table;
  ecs_entities_t to_remove;
  ecs_entity_info_t info;
  ecs_entity_t buffer [32];
  ecs_world_t *local_170;
  ecs_entities_t local_168;
  ecs_entity_info_t local_158;
  ecs_entities_t local_138;
  ecs_entity_t local_128 [32];
  
  local_170 = world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x702);
  if (local_170 == (ecs_world_t *)0x0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x702,"void ecs_clear(ecs_world_t *, ecs_entity_t)");
  }
  _ecs_assert(entity != 0,2,(char *)0x0,"entity != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x703);
  if (entity != 0) {
    stage = ecs_get_stage(&local_170);
    _Var1 = ecs_defer_clear(local_170,stage,entity);
    if (!_Var1) {
      local_158.table = (ecs_table_t *)0x0;
      ecs_get_info(local_170,entity,&local_158);
      if (local_158.table != (ecs_table_t *)0x0) {
        vector = (local_158.table)->type;
        peVar2 = (ecs_entity_t *)_ecs_vector_first(vector,8,0x10);
        local_168.count = ecs_vector_count(vector);
        world_00 = local_170;
        local_168.array = peVar2;
        _ecs_assert(local_168.count < 0x20,2,(char *)0x0,"components->count < ECS_MAX_ADD_REMOVE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x596);
        if (0x1f < local_168.count) {
          __assert_fail("components->count < (32)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x596,
                        "void remove_entities_w_info(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_entities_t *)"
                       );
        }
        local_138.array = local_128;
        local_138.count = 0;
        dst_table = ecs_table_traverse_remove(world_00,local_158.table,&local_168,&local_138);
        commit(world_00,entity,&local_158,dst_table,(ecs_entities_t *)0x0,&local_138);
      }
      ecs_defer_flush(local_170,stage);
    }
    return;
  }
  __assert_fail("entity != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x703,"void ecs_clear(ecs_world_t *, ecs_entity_t)");
}

Assistant:

void ecs_clear(
    ecs_world_t *world,
    ecs_entity_t entity)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(entity != 0, ECS_INVALID_PARAMETER, NULL);

    ecs_stage_t *stage = ecs_get_stage(&world);
    if (ecs_defer_clear(world, stage, entity)) {
        return;
    }

    ecs_entity_info_t info;
    info.table = NULL;

    ecs_get_info(world, entity, &info);

    ecs_table_t *table = info.table;
    if (table) {
        ecs_type_t type = table->type;

        /* Remove all components */
        ecs_entities_t to_remove = ecs_type_to_entities(type);
        remove_entities_w_info(world, entity, &info, &to_remove);
    }    

    ecs_defer_flush(world, stage);
}